

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Function::Function(Function *this)

{
  Function *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::vector(&this->m_parameters);
  VariableType::VariableType(&this->m_returnType);
  BlockStatement::BlockStatement(&this->m_functionBlock);
  return;
}

Assistant:

Function::Function (void)
{
}